

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QIBusAttribute>::emplace<QIBusAttribute>
          (QMovableArrayOps<QIBusAttribute> *this,qsizetype i,QIBusAttribute *args)

{
  QIBusAttribute **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  QIBusAttribute tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.size
        == i) {
      qVar5 = QArrayDataPointer<QIBusAttribute>::freeSpaceAtEnd
                        ((QArrayDataPointer<QIBusAttribute> *)this);
      if (qVar5 == 0) goto LAB_0011b2ab;
      QIBusAttribute::QIBusAttribute
                ((this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr +
                 (this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.size,args);
LAB_0011b39a:
      pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                super_QArrayDataPointer<QIBusAttribute>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0011b359;
    }
LAB_0011b2ab:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QIBusAttribute>::freeSpaceAtBegin
                        ((QArrayDataPointer<QIBusAttribute> *)this);
      if (qVar5 != 0) {
        QIBusAttribute::QIBusAttribute
                  ((this->super_QGenericArrayOps<QIBusAttribute>).
                   super_QArrayDataPointer<QIBusAttribute>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                   super_QArrayDataPointer<QIBusAttribute>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0011b39a;
      }
    }
  }
  tmp.type = 0xaaaaaaaa;
  tmp.value = 0xaaaaaaaa;
  tmp.start = 0xaaaaaaaa;
  tmp.end = 0xaaaaaaaa;
  tmp.super_QIBusSerializable.name.d.size = -0x5555555555555556;
  tmp.super_QIBusSerializable.attachments.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.super_QIBusSerializable.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QIBusAttribute::QIBusAttribute(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
          size != 0;
  QArrayDataPointer<QIBusAttribute>::detachAndGrow
            ((QArrayDataPointer<QIBusAttribute> *)this,(uint)(i == 0 && bVar6),1,
             (QIBusAttribute **)0x0,(QArrayDataPointer<QIBusAttribute> *)0x0);
  if (i == 0 && bVar6) {
    QIBusAttribute::QIBusAttribute
              ((this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QIBusAttribute> *)this,i,1);
    QIBusAttribute::QIBusAttribute(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QIBusSerializable::~QIBusSerializable(&tmp.super_QIBusSerializable);
LAB_0011b359:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }